

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::FileExists(char *filename,bool isFile)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  if (filename == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,filename,&local_31);
    bVar1 = FileExists(&local_30,isFile);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool SystemTools::FileExists(const char* filename, bool isFile)
{
  if (!filename) {
    return false;
  }
  return SystemTools::FileExists(std::string(filename), isFile);
}